

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_agent_forward_ok.c
# Opt level: O0

int test(LIBSSH2_SESSION *session)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 uVar7;
  char *userauth_list;
  LIBSSH2_CHANNEL *channel;
  int rc;
  LIBSSH2_SESSION *session_local;
  
  pcVar5 = username;
  sVar4 = strlen(username);
  pcVar5 = (char *)libssh2_userauth_list(session,pcVar5,sVar4 & 0xffffffff);
  if (pcVar5 == (char *)0x0) {
    print_last_session_error("libssh2_userauth_list");
    session_local._4_4_ = 1;
  }
  else {
    pcVar6 = strstr(pcVar5,"publickey");
    pcVar1 = username;
    if (pcVar6 == (char *)0x0) {
      fprintf(_stderr,"\'publickey\' was expected in userauth list: %s\n",pcVar5);
      session_local._4_4_ = 1;
    }
    else {
      sVar4 = strlen(username);
      pcVar5 = srcdir_path(key_file_public);
      pcVar6 = srcdir_path(key_file_private);
      iVar2 = libssh2_userauth_publickey_fromfile_ex
                        (session,pcVar1,sVar4 & 0xffffffff,pcVar5,pcVar6,0);
      if (iVar2 == 0) {
        uVar7 = libssh2_channel_open_ex(session,"session",7,0x200000,0x8000,0,0);
        uVar3 = libssh2_channel_request_auth_agent(uVar7);
        if (uVar3 == 0) {
          session_local._4_4_ = 0;
        }
        else {
          fprintf(_stderr,"Auth agent request for agent forwarding failed, error code %d\n",
                  (ulong)uVar3);
          session_local._4_4_ = 1;
        }
      }
      else {
        print_last_session_error("libssh2_userauth_publickey_fromfile_ex");
        session_local._4_4_ = 1;
      }
    }
  }
  return session_local._4_4_;
}

Assistant:

int test(LIBSSH2_SESSION *session)
{
    int rc;
    LIBSSH2_CHANNEL *channel;

    const char *userauth_list =
        libssh2_userauth_list(session, username,
                              (unsigned int)strlen(username));
    if(!userauth_list) {
        print_last_session_error("libssh2_userauth_list");
        return 1;
    }

    if(!strstr(userauth_list, "publickey")) {
        fprintf(stderr, "'publickey' was expected in userauth list: %s\n",
                userauth_list);
        return 1;
    }

    rc = libssh2_userauth_publickey_fromfile_ex(session, username,
                                                (unsigned int)strlen(username),
                                                srcdir_path(key_file_public),
                                                srcdir_path(key_file_private),
                                                NULL);
    if(rc) {
        print_last_session_error("libssh2_userauth_publickey_fromfile_ex");
        return 1;
    }

    channel = libssh2_channel_open_session(session);
    #if 0
    if(!channel) {
        printf("Error opening channel\n");
        return 1;
    }
    #endif

    rc = libssh2_channel_request_auth_agent(channel);
    if(rc) {
        fprintf(stderr, "Auth agent request for agent forwarding failed, "
            "error code %d\n", rc);
        return 1;
    }

    return 0;
}